

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlNodeGetSpacePreserve(xmlNode *cur)

{
  int iVar1;
  xmlChar *pxStack_20;
  int res;
  xmlChar *space;
  xmlNode *cur_local;
  
  if ((cur != (xmlNode *)0x0) && (space = (xmlChar *)cur, cur->type == XML_ELEMENT_NODE)) {
    for (; space != (xmlChar *)0x0; space = *(xmlChar **)(space + 0x28)) {
      iVar1 = xmlNodeGetAttrValue((xmlNode *)space,"space",
                                  (xmlChar *)"http://www.w3.org/XML/1998/namespace",
                                  &stack0xffffffffffffffe0);
      if (iVar1 < 0) {
        return -1;
      }
      if (pxStack_20 != (xmlChar *)0x0) {
        iVar1 = xmlStrEqual(pxStack_20,(xmlChar *)"preserve");
        if (iVar1 != 0) {
          (*xmlFree)(pxStack_20);
          return 1;
        }
        iVar1 = xmlStrEqual(pxStack_20,"default");
        if (iVar1 != 0) {
          (*xmlFree)(pxStack_20);
          return 0;
        }
        (*xmlFree)(pxStack_20);
      }
    }
  }
  return -1;
}

Assistant:

int
xmlNodeGetSpacePreserve(const xmlNode *cur) {
    xmlChar *space;
        int res;

    if ((cur == NULL) || (cur->type != XML_ELEMENT_NODE))
        return(-1);

    while (cur != NULL) {
	res = xmlNodeGetAttrValue(cur, BAD_CAST "space", XML_XML_NAMESPACE,
                                  &space);
        if (res < 0)
            return(-1);
	if (space != NULL) {
	    if (xmlStrEqual(space, BAD_CAST "preserve")) {
		xmlFree(space);
		return(1);
	    }
	    if (xmlStrEqual(space, BAD_CAST "default")) {
		xmlFree(space);
		return(0);
	    }
	    xmlFree(space);
	}

	cur = cur->parent;
    }

    return(-1);
}